

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_utilities.h
# Opt level: O2

type dlib::
     matrix_multiply_helper<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_colm2<dlib::matrix<float,0l,1l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>>>>>,dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_rowm2<dlib::matrix<float,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::column_major_layout>>>>>,0l,0l>
     ::
     eval<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_rowm2<dlib::matrix<float,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::column_major_layout>>>>>,dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_colm2<dlib::matrix<float,0l,1l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>>>>>>
               (matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_rowm2<dlib::matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::column_major_layout>_>_>_>_>
                *rhs,matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_colm2<dlib::matrix<float,_0L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>_>
                     *lhs,long r,long c)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  matrix_op<dlib::op_colm2<dlib::matrix<float,_0L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>
  *pmVar4;
  matrix_op<dlib::op_rowm2<dlib::matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::column_major_layout>_>_>
  *pmVar5;
  matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::column_major_layout>
  *pmVar6;
  undefined1 auVar7 [16];
  long lVar8;
  long lVar9;
  undefined1 auVar10 [64];
  
  pmVar4 = (lhs->op).m;
  pmVar5 = (rhs->op).m;
  pfVar1 = (((pmVar4->op).m)->data).data + (pmVar4->op).col;
  pmVar6 = (pmVar5->op).m;
  pfVar2 = (pmVar6->data).data + (pmVar5->op).row;
  auVar10 = ZEXT464((uint)(*pfVar1 * *pfVar2));
  lVar8 = 1;
  while (lVar8 < (pmVar4->op).length) {
    pfVar3 = pfVar1 + lVar8;
    lVar9 = (pmVar6->data).nr_ * lVar8;
    lVar8 = lVar8 + 1;
    auVar7 = vfmadd231ss_fma(auVar10._0_16_,ZEXT416((uint)*pfVar3),ZEXT416((uint)pfVar2[lVar9]));
    auVar10 = ZEXT1664(auVar7);
  }
  return auVar10._0_4_;
}

Assistant:

const_ret_type apply (long r, long c) const { return m(c,r); }